

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

void deqp::RobustBufferAccessBehavior::Texture::GetData
               (Functions *gl,GLuint id,GLint level,GLuint width,GLuint height,GLenum format,
               GLenum type,GLvoid *out_data)

{
  GLenum GVar1;
  GLuint local_28;
  GLenum local_24;
  GLuint fbo;
  GLenum format_local;
  GLuint height_local;
  GLuint width_local;
  GLint level_local;
  GLuint id_local;
  Functions *gl_local;
  
  local_24 = format;
  fbo = height;
  format_local = width;
  height_local = level;
  width_local = id;
  _level_local = gl;
  (*gl->genFramebuffers)(1,&local_28);
  GVar1 = (*_level_local->getError)();
  glu::checkError(GVar1,"GenFramebuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x2f7);
  (*_level_local->bindFramebuffer)(0x8d40,local_28);
  GVar1 = (*_level_local->getError)();
  glu::checkError(GVar1,"BindFramebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x2f9);
  (*_level_local->framebufferTexture2D)(0x8d40,0x8ce0,0xde1,width_local,height_local);
  GVar1 = (*_level_local->getError)();
  glu::checkError(GVar1,"FramebufferTexture2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x2fb);
  (*_level_local->readPixels)(0,0,format_local,fbo,local_24,type,out_data);
  GVar1 = (*_level_local->getError)();
  glu::checkError(GVar1,"ReadPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x2fe);
  (*_level_local->bindFramebuffer)(0x8d40,0);
  return;
}

Assistant:

void Texture::GetData(const glw::Functions& gl, glw::GLuint id, glw::GLint level, glw::GLuint width, glw::GLuint height,
					  glw::GLenum format, glw::GLenum type, glw::GLvoid* out_data)
{
	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenFramebuffers");
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, id, level);
	GLU_EXPECT_NO_ERROR(gl.getError(), "FramebufferTexture2D");

	gl.readPixels(0, 0, width, height, format, type, out_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ReadPixels");

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
}